

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O2

bool __thiscall gimage::TIFFImageIO::handlesFile(TIFFImageIO *this,char *name,bool reading)

{
  long lVar1;
  bool bVar2;
  allocator local_31;
  string s;
  
  std::__cxx11::string::string((string *)&s,name,&local_31);
  if (s._M_string_length < 5) {
    bVar2 = false;
  }
  else {
    lVar1 = std::__cxx11::string::rfind((char *)&s,0x12d141);
    bVar2 = true;
    if (lVar1 != s._M_string_length - 4) {
      lVar1 = std::__cxx11::string::rfind((char *)&s,0x12d89f);
      if (lVar1 != s._M_string_length - 4) {
        lVar1 = std::__cxx11::string::rfind((char *)&s,0x12d8a4);
        if (lVar1 != s._M_string_length - 5) {
          lVar1 = std::__cxx11::string::rfind((char *)&s,0x12d8aa);
          bVar2 = lVar1 == s._M_string_length - 5;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&s);
  return bVar2;
}

Assistant:

bool TIFFImageIO::handlesFile(const char *name, bool reading) const
{
  std::string s=name;

  if (s.size() < 5)
  {
    return false;
  }

  if (s.rfind(".tif") == s.size()-4 || s.rfind(".TIF") == s.size()-4 ||
    s.rfind(".tiff") == s.size()-5 || s.rfind(".TIFF") == s.size()-5)
  {
    return true;
  }

  return false;
}